

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>
* testing::internal::
  MatcherCastImpl<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
  ::CastImpl(Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>
             *__return_storage_ptr__,
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
            *value)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  local_40;
  
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_true>
            (&local_40,value);
  Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>
  ::Matcher(__return_storage_ptr__,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

static Matcher<T> CastImpl(const M& value,
                             std::false_type /* convertible_to_matcher */,
                             std::true_type /* convertible_to_T */) {
    return Matcher<T>(ImplicitCast_<T>(value));
  }